

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void __thiscall
duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
Operation<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
          (ArgMinMaxBase<duckdb::GreaterThan,true> *this,
          ArgMinMaxState<double,_duckdb::string_t> *state,double *x,string_t *y,
          AggregateBinaryInput *binary)

{
  string_t y_data;
  string_t new_value;
  
  if (*this != (ArgMinMaxBase<duckdb::GreaterThan,true>)0x0) {
    y_data.value.pointer.ptr = (char *)y;
    y_data.value._0_8_ = x[1];
    Execute<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
              (this,(ArgMinMaxState<double,_duckdb::string_t> *)*x,*(double *)state,y_data,binary);
    return;
  }
  *(undefined8 *)(this + 8) = *(undefined8 *)state;
  new_value.value.pointer.ptr = (char *)y;
  new_value.value._0_8_ = x[1];
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)(this + 0x10),(string_t *)*x,new_value);
  *this = (ArgMinMaxBase<duckdb::GreaterThan,true>)0x1;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}